

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

TString * LoadString(LoadState *S)

{
  char *str;
  char *s;
  size_t size;
  LoadState *S_local;
  
  size = (size_t)S;
  LoadBlock(S,&s,8);
  if (s == (char *)0x0) {
    S_local = (LoadState *)0x0;
  }
  else {
    str = luaZ_openspace(*(lua_State **)size,*(Mbuffer **)(size + 0x10),(size_t)s);
    LoadBlock((LoadState *)size,str,(size_t)s);
    S_local = (LoadState *)luaS_newlstr(*(lua_State **)size,str,(size_t)(s + -1));
  }
  return (TString *)S_local;
}

Assistant:

static TString* LoadString(LoadState* S)
{
 size_t size;
 LoadVar(S,size);
 if (size==0)
  return NULL;
 else
 {
  char* s=luaZ_openspace(S->L,S->b,size);
  LoadBlock(S,s,size);
  return luaS_newlstr(S->L,s,size-1);		/* remove trailing '\0' */
 }
}